

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::syncBackingStore(QWidgetPrivate *this,QRegion *region)

{
  bool bVar1;
  QWidgetRepaintManager *this_00;
  QWidgetPrivate *in_RSI;
  QWidgetPrivate *in_RDI;
  QWidgetRepaintManager *repaintManager;
  QRegion *in_stack_00000028;
  QWidgetPrivate *in_stack_00000030;
  QWidgetPrivate *in_stack_ffffffffffffffd8;
  
  bVar1 = shouldPaintOnScreen(in_stack_ffffffffffffffd8);
  if (bVar1) {
    paintOnScreen(in_stack_00000030,in_stack_00000028);
  }
  else {
    this_00 = maybeRepaintManager(in_RSI);
    if (this_00 != (QWidgetRepaintManager *)0x0) {
      q_func(in_RDI);
      QWidgetRepaintManager::sync((QWidgetRepaintManager *)this_00);
    }
  }
  return;
}

Assistant:

void QWidgetPrivate::syncBackingStore(const QRegion &region)
{
    if (shouldPaintOnScreen())
        paintOnScreen(region);
    else if (QWidgetRepaintManager *repaintManager = maybeRepaintManager()) {
        repaintManager->sync(q_func(), region);
    }
}